

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Bounds3f * __thiscall pbrt::AnimatedTransform::MotionBounds(AnimatedTransform *this,Bounds3f *b)

{
  undefined1 auVar1 [16];
  long in_RSI;
  Bounds3f *in_RDI;
  undefined8 extraout_XMM0_Qb;
  Point3<float> PVar2;
  int corner;
  AnimatedTransform *in_stack_000000a8;
  int in_stack_ffffffffffffff7c;
  Bounds3<float> *in_stack_ffffffffffffff80;
  undefined4 local_5c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uStack_48;
  int local_44;
  Bounds3f *in_stack_ffffffffffffffc8;
  Transform *in_stack_ffffffffffffffd0;
  
  if ((*(byte *)(in_RSI + 0x108) & 1) == 0) {
    Transform::operator()(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else if ((*(byte *)(in_RSI + 0x1c4) & 1) == 0) {
    Transform::operator()(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    Transform::operator()(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    Union<float>((Bounds3<float> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (Bounds3<float> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  else {
    Bounds3<float>::Bounds3(in_stack_ffffffffffffff80);
    for (local_44 = 0; local_44 < 8; local_44 = local_44 + 1) {
      PVar2 = Bounds3<float>::Corner(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      auVar1._8_8_ = extraout_XMM0_Qb;
      auVar1._0_8_ = PVar2.super_Tuple3<pbrt::Point3,_float>._0_8_;
      in_stack_ffffffffffffff80 = (Bounds3<float> *)vmovlpd_avx(auVar1);
      BoundPointMotion(in_stack_000000a8,(Point3f *)this);
      Union<float>((Bounds3<float> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (Bounds3<float> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      (in_RDI->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)local_5c;
      (in_RDI->pMin).super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_ffffffffffffffa8;
      *(ulong *)&(in_RDI->pMin).super_Tuple3<pbrt::Point3,_float>.z =
           CONCAT44(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      (in_RDI->pMax).super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_ffffffffffffffb4;
      (in_RDI->pMax).super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_48;
    }
  }
  return in_RDI;
}

Assistant:

Bounds3f AnimatedTransform::MotionBounds(const Bounds3f &b) const {
    // Handle easy cases for _Bounds3f_ motion bounds
    if (!actuallyAnimated)
        return startTransform(b);
    if (!hasRotation)
        return Union(startTransform(b), endTransform(b));

    // Return motion bounds accounting for animated rotation
    Bounds3f bounds;
    for (int corner = 0; corner < 8; ++corner)
        bounds = Union(bounds, BoundPointMotion(b.Corner(corner)));
    return bounds;
}